

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Step(Vdbe *p)

{
  sqlite3 *db_00;
  int iVar1;
  uint local_24;
  int rc;
  sqlite3 *db;
  Vdbe *p_local;
  
  if (p->magic != 0x2df20da3) {
    sqlite3_reset((sqlite3_stmt *)p);
  }
  db_00 = p->db;
  if (db_00->mallocFailed == '\0') {
    if ((p->pc < 0) && ((*(ushort *)&p->field_0xc5 & 3) != 0)) {
      p->rc = 0x11;
      local_24 = 1;
    }
    else {
      if (p->pc < 0) {
        if (db_00->nVdbeActive == 0) {
          (db_00->u1).isInterrupted = 0;
        }
        if ((((db_00->mTrace & 0x82) != 0) && ((db_00->init).busy == '\0')) &&
           (p->zSql != (char *)0x0)) {
          sqlite3OsCurrentTimeInt64(db_00->pVfs,&p->startTime);
        }
        db_00->nVdbeActive = db_00->nVdbeActive + 1;
        if ((*(ushort *)&p->field_0xc5 >> 8 & 1) == 0) {
          db_00->nVdbeWrite = db_00->nVdbeWrite + 1;
        }
        if ((*(ushort *)&p->field_0xc5 >> 9 & 1) != 0) {
          db_00->nVdbeRead = db_00->nVdbeRead + 1;
        }
        p->pc = 0;
      }
      if ((*(ushort *)&p->field_0xc5 >> 2 & 3) == 0) {
        db_00->nVdbeExec = db_00->nVdbeExec + 1;
        local_24 = sqlite3VdbeExec(p);
        db_00->nVdbeExec = db_00->nVdbeExec + -1;
      }
      else {
        local_24 = sqlite3VdbeList(p);
      }
      if (local_24 != 100) {
        if (0 < p->startTime) {
          invokeProfileCallback(db_00,p);
        }
        if ((local_24 == 0x65) && (db_00->autoCommit != '\0')) {
          iVar1 = doWalCallbacks(db_00);
          p->rc = iVar1;
          if (p->rc != 0) {
            local_24 = 1;
          }
        }
      }
      db_00->errCode = local_24;
      iVar1 = sqlite3ApiExit(p->db,p->rc);
      if (iVar1 == 7) {
        p->rc = 7;
      }
    }
    if (((local_24 != 100) && (local_24 != 0x65)) && ((p->prepFlags & 0x80) != 0)) {
      local_24 = sqlite3VdbeTransferError(p);
    }
    p_local._4_4_ = local_24 & db_00->errMask;
  }
  else {
    p->rc = 7;
    p_local._4_4_ = 7;
  }
  return p_local._4_4_;
}

Assistant:

static int sqlite3Step(Vdbe *p){
  sqlite3 *db;
  int rc;

  assert(p);
  if( p->magic!=VDBE_MAGIC_RUN ){
    /* We used to require that sqlite3_reset() be called before retrying
    ** sqlite3_step() after any error or after SQLITE_DONE.  But beginning
    ** with version 3.7.0, we changed this so that sqlite3_reset() would
    ** be called automatically instead of throwing the SQLITE_MISUSE error.
    ** This "automatic-reset" change is not technically an incompatibility, 
    ** since any application that receives an SQLITE_MISUSE is broken by
    ** definition.
    **
    ** Nevertheless, some published applications that were originally written
    ** for version 3.6.23 or earlier do in fact depend on SQLITE_MISUSE 
    ** returns, and those were broken by the automatic-reset change.  As a
    ** a work-around, the SQLITE_OMIT_AUTORESET compile-time restores the
    ** legacy behavior of returning SQLITE_MISUSE for cases where the 
    ** previous sqlite3_step() returned something other than a SQLITE_LOCKED
    ** or SQLITE_BUSY error.
    */
#ifdef SQLITE_OMIT_AUTORESET
    if( (rc = p->rc&0xff)==SQLITE_BUSY || rc==SQLITE_LOCKED ){
      sqlite3_reset((sqlite3_stmt*)p);
    }else{
      return SQLITE_MISUSE_BKPT;
    }
#else
    sqlite3_reset((sqlite3_stmt*)p);
#endif
  }

  /* Check that malloc() has not failed. If it has, return early. */
  db = p->db;
  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM;
    return SQLITE_NOMEM_BKPT;
  }

  if( p->pc<0 && p->expired ){
    p->rc = SQLITE_SCHEMA;
    rc = SQLITE_ERROR;
    goto end_of_step;
  }
  if( p->pc<0 ){
    /* If there are no other statements currently running, then
    ** reset the interrupt flag.  This prevents a call to sqlite3_interrupt
    ** from interrupting a statement that has not yet started.
    */
    if( db->nVdbeActive==0 ){
      db->u1.isInterrupted = 0;
    }

    assert( db->nVdbeWrite>0 || db->autoCommit==0 
        || (db->nDeferredCons==0 && db->nDeferredImmCons==0)
    );

#ifndef SQLITE_OMIT_TRACE
    if( (db->mTrace & (SQLITE_TRACE_PROFILE|SQLITE_TRACE_XPROFILE))!=0
        && !db->init.busy && p->zSql ){
      sqlite3OsCurrentTimeInt64(db->pVfs, &p->startTime);
    }else{
      assert( p->startTime==0 );
    }
#endif

    db->nVdbeActive++;
    if( p->readOnly==0 ) db->nVdbeWrite++;
    if( p->bIsReader ) db->nVdbeRead++;
    p->pc = 0;
  }
#ifdef SQLITE_DEBUG
  p->rcApp = SQLITE_OK;
#endif
#ifndef SQLITE_OMIT_EXPLAIN
  if( p->explain ){
    rc = sqlite3VdbeList(p);
  }else
#endif /* SQLITE_OMIT_EXPLAIN */
  {
    db->nVdbeExec++;
    rc = sqlite3VdbeExec(p);
    db->nVdbeExec--;
  }

  if( rc!=SQLITE_ROW ){
#ifndef SQLITE_OMIT_TRACE
    /* If the statement completed successfully, invoke the profile callback */
    checkProfileCallback(db, p);
#endif

    if( rc==SQLITE_DONE && db->autoCommit ){
      assert( p->rc==SQLITE_OK );
      p->rc = doWalCallbacks(db);
      if( p->rc!=SQLITE_OK ){
        rc = SQLITE_ERROR;
      }
    }
  }

  db->errCode = rc;
  if( SQLITE_NOMEM==sqlite3ApiExit(p->db, p->rc) ){
    p->rc = SQLITE_NOMEM_BKPT;
  }
end_of_step:
  /* At this point local variable rc holds the value that should be 
  ** returned if this statement was compiled using the legacy 
  ** sqlite3_prepare() interface. According to the docs, this can only
  ** be one of the values in the first assert() below. Variable p->rc 
  ** contains the value that would be returned if sqlite3_finalize() 
  ** were called on statement p.
  */
  assert( rc==SQLITE_ROW  || rc==SQLITE_DONE   || rc==SQLITE_ERROR 
       || (rc&0xff)==SQLITE_BUSY || rc==SQLITE_MISUSE
  );
  assert( (p->rc!=SQLITE_ROW && p->rc!=SQLITE_DONE) || p->rc==p->rcApp );
  if( rc!=SQLITE_ROW 
   && rc!=SQLITE_DONE
   && (p->prepFlags & SQLITE_PREPARE_SAVESQL)!=0
  ){
    /* If this statement was prepared using saved SQL and an 
    ** error has occurred, then return the error code in p->rc to the
    ** caller. Set the error code in the database handle to the same value.
    */ 
    rc = sqlite3VdbeTransferError(p);
  }
  return (rc&db->errMask);
}